

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O3

void __thiscall
Formula_Constraint::Formula_Constraint(Formula_Constraint *this,Formula_Constraint *proto_formula)

{
  Am_Wrapper *pAVar1;
  
  (this->super_Am_Formula_Advanced).super_Am_Constraint.super_Am_Registered_Type.
  _vptr_Am_Registered_Type = (_func_int **)&PTR_ID_002e2508;
  this->type = proto_formula->type;
  this->internal_remove = false;
  this->flags = proto_formula->flags;
  (this->context).data = (Am_Slot_Data *)0x0;
  this->formula = proto_formula->formula;
  this->depends_on = (Dependency *)0x0;
  pAVar1 = proto_formula->data;
  this->data = pAVar1;
  this->prototype = (Formula_Constraint *)0x0;
  this->first_instance = (Formula_Constraint *)0x0;
  this->next_instance = (Formula_Constraint *)0x0;
  if (pAVar1 != (Am_Wrapper *)0x0) {
    pAVar1->refs = pAVar1->refs + 1;
  }
  return;
}

Assistant:

Formula_Constraint::Formula_Constraint(Formula_Constraint *proto_formula)
    : context(nullptr), formula(proto_formula->formula), type(proto_formula->type),
#ifdef DEBUG
      formula_name(proto_formula->formula_name),
#endif
      flags(proto_formula->flags), data(proto_formula->data), depends_on(nullptr),
      prototype(nullptr), first_instance(nullptr), next_instance(nullptr),
      internal_remove(false)
{
  if (proto_formula->data)
    proto_formula->data->Note_Reference();
}